

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O2

void scp_sink_coroutine(ScpSink *scp)

{
  fxp_attrs *pfVar1;
  SftpReplyBuilder *pSVar2;
  SftpServer *pSVar3;
  uchar *puVar4;
  ptrlen pVar5;
  ptrlen pVar6;
  ptrlen pVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  void *pvVar12;
  byte *pbVar13;
  ulonglong uVar14;
  char *pcVar15;
  size_t sVar16;
  SshChannelVtable *pSVar17;
  strbuf *psVar18;
  unsigned_long uVar19;
  char *fmt;
  SshChannel *pSVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  ptrlen pVar24;
  unsigned_long dummy1;
  uint64_t uStack_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  unsigned_long local_58;
  unsigned_long uStack_50;
  unsigned_long local_48;
  unsigned_long dummy2;
  
  iVar9 = scp->crState;
  if (iVar9 != 0x4e8) {
    if (iVar9 == 0x439) goto LAB_0010fac7;
    if (iVar9 == 0x4a3) goto LAB_0010fecf;
    if (iVar9 == 0x4c0) goto LAB_0010ff71;
    if (iVar9 == 0) {
LAB_0010fa9f:
      (*scp->sc->vt->write)(scp->sc,false,"",1);
      strbuf_clear(scp->command);
      do {
        scp->crState = 0x439;
LAB_0010fac7:
        bVar8 = scp->input_eof;
        if ((_Bool)bVar8 == false) {
          sVar11 = bufchain_size(&scp->data);
          if (sVar11 == 0) {
            return;
          }
          bVar8 = scp->input_eof;
        }
        if ((bVar8 & 1) != 0) goto LAB_0010ffc0;
        pVar24 = bufchain_prefix(&scp->data);
        pvVar12 = memchr(pVar24.ptr,10,pVar24.len);
        sVar11 = (long)(((int)pvVar12 - (int)pVar24.ptr) + 1);
        if (pvVar12 == (void *)0x0) {
          sVar11 = pVar24.len;
        }
        BinarySink_put_data(scp->command->binarysink_,pVar24.ptr,sVar11);
        bufchain_consume(&scp->data,sVar11);
      } while (pvVar12 == (void *)0x0);
      strbuf_chomp(scp->command,'\n');
      psVar18 = scp->command;
      sVar11 = psVar18->len;
      if (sVar11 == 0) {
        scp->command_chr = '\0';
        sVar11 = 0;
        goto LAB_0010fe2c;
      }
      pbVar13 = (byte *)psVar18->s;
      bVar8 = *pbVar13;
      scp->command_chr = bVar8;
      if (bVar8 - 0x43 < 2) {
        pfVar1 = &scp->attrs;
        (scp->attrs).flags = 4;
        pbVar13 = pbVar13 + 2;
        uVar19 = 0;
        pbVar21 = pbVar13;
        while( true ) {
          (scp->attrs).permissions = uVar19;
          bVar8 = pbVar13[-1];
          if ((bVar8 & 0xf8) != 0x30) break;
          uVar19 = (ulong)(byte)(bVar8 - 0x30) + uVar19 * 8;
          pbVar21 = pbVar21 + 1;
          pbVar13 = pbVar13 + 1;
        }
        pbVar22 = pbVar13;
        if (bVar8 == 0x20) {
          do {
            bVar8 = *pbVar22;
            pbVar22 = pbVar22 + 1;
            pbVar21 = pbVar21 + 1;
          } while ((byte)(bVar8 - 0x30) < 10);
          if (bVar8 != 0x20) goto LAB_0010fe2c;
          uVar14 = strtoull((char *)pbVar13,(char **)0x0,10);
          scp->file_size = uVar14;
          sVar11 = scp->command->len;
          pcVar15 = scp->command->s;
          strbuf_clear(scp->filename_sb);
          BinarySink_put_datapl(scp->filename_sb->binarysink_,scp->head->destpath);
          if (scp->head->isdir == true) {
            psVar18 = scp->filename_sb;
            if ((psVar18->len != 0) && (psVar18->s[psVar18->len - 1] != '/')) {
              BinarySink_put_byte(psVar18->binarysink_,'/');
              psVar18 = scp->filename_sb;
            }
            pVar24.len = (size_t)(pcVar15 + (sVar11 - (long)pbVar21));
            pVar24.ptr = pbVar22;
            BinarySink_put_datapl(psVar18->binarysink_,pVar24);
          }
          psVar18 = scp->filename_sb;
          sVar11 = psVar18->len;
          pVar6.ptr = psVar18->u;
          pVar6.len = psVar18->len;
          pVar5.ptr = psVar18->u;
          pVar5.len = psVar18->len;
          (scp->filename).ptr = psVar18->u;
          (scp->filename).len = sVar11;
          if (scp->got_file_times == true) {
            uVar19 = scp->mtime;
            (scp->attrs).atime = scp->atime;
            (scp->attrs).mtime = uVar19;
            *(byte *)&(scp->attrs).flags = (byte)(scp->attrs).flags | 8;
          }
          scp->got_file_times = false;
          pSVar2 = &(scp->reply).srb;
          pSVar3 = scp->sf;
          if (scp->command_chr == 'D') {
            local_48 = (scp->attrs).mtime;
            dummy1 = pfVar1->flags;
            uStack_70 = (scp->attrs).size;
            local_68 = (scp->attrs).uid;
            uStack_60 = (scp->attrs).gid;
            local_58 = (scp->attrs).permissions;
            uStack_50 = (scp->attrs).atime;
            (*pSVar3->vt->mkdir)(pSVar3,pSVar2,pVar5,*pfVar1);
            if ((scp->reply).err == true) {
              uVar10 = string_length_for_printf((scp->filename).len);
              pvVar12 = (scp->filename).ptr;
              pcVar15 = (scp->reply).errmsg;
              fmt = "\'%.*s\': unable to create directory: %s";
LAB_0010fea6:
              pcVar15 = dupprintf(fmt,(ulong)uVar10,pvVar12,pcVar15);
              goto LAB_0010feaf;
            }
            scp_sink_push(scp,scp->filename,true);
          }
          else {
            local_48 = (scp->attrs).mtime;
            dummy1 = pfVar1->flags;
            uStack_70 = (scp->attrs).size;
            local_68 = (scp->attrs).uid;
            uStack_60 = (scp->attrs).gid;
            local_58 = (scp->attrs).permissions;
            uStack_50 = (scp->attrs).atime;
            (*pSVar3->vt->open)(pSVar3,pSVar2,pVar6,0x1a,*pfVar1);
            if ((scp->reply).err == true) {
              uVar10 = string_length_for_printf((scp->filename).len);
              pvVar12 = (scp->filename).ptr;
              pcVar15 = (scp->reply).errmsg;
              fmt = "\'%.*s\': unable to open file: %s";
              goto LAB_0010fea6;
            }
            uVar23 = 0;
            (*scp->sc->vt->write)(scp->sc,false,"",1);
            scp->file_offset = 0;
            while (uVar23 < scp->file_size) {
              scp->crState = 0x4a3;
LAB_0010fecf:
              bVar8 = scp->input_eof;
              if ((_Bool)bVar8 == false) {
                sVar11 = bufchain_size(&scp->data);
                if (sVar11 == 0) {
                  return;
                }
                bVar8 = scp->input_eof;
              }
              if ((bVar8 & 1) != 0) goto LAB_0010ffa2;
              pVar24 = bufchain_prefix(&scp->data);
              dummy1 = (unsigned_long)pVar24.ptr;
              uVar23 = scp->file_size - scp->file_offset;
              if (pVar24.len < uVar23) {
                uVar23 = pVar24.len;
              }
              pVar7.len = uVar23;
              pVar7.ptr = (void *)dummy1;
              uStack_70 = uVar23;
              (*scp->sf->vt->write)
                        (scp->sf,&(scp->reply).srb,(scp->reply).handle,scp->file_offset,pVar7);
              if ((scp->reply).err == true) {
                uVar10 = string_length_for_printf((scp->filename).len);
                pvVar12 = (scp->filename).ptr;
                pcVar15 = (scp->reply).errmsg;
                fmt = "\'%.*s\': unable to write to file: %s";
                goto LAB_0010fea6;
              }
              bufchain_consume(&scp->data,uVar23);
              uVar23 = uVar23 + scp->file_offset;
              scp->file_offset = uVar23;
            }
            scp->crState = 0x4c0;
LAB_0010ff71:
            bVar8 = scp->input_eof;
            if ((_Bool)bVar8 == false) {
              sVar11 = bufchain_size(&scp->data);
              if (sVar11 == 0) {
                return;
              }
              bVar8 = scp->input_eof;
            }
            if ((bVar8 & 1) != 0) goto LAB_0010ffa2;
            bufchain_consume(&scp->data,1);
          }
          goto LAB_0010fa9f;
        }
      }
      else {
        if (bVar8 == 0x45) {
          if (scp->head == (ScpSinkStackEntry *)0x0) {
            pcVar15 = dupstr("received E command without matching D");
LAB_0010feaf:
            scp->errmsg = pcVar15;
            goto LAB_0010ffc0;
          }
          scp_sink_pop(scp);
          scp->got_file_times = false;
          goto LAB_0010fa9f;
        }
        if (bVar8 == 0x54) {
          iVar9 = __isoc99_sscanf(pbVar13,"T%lu %lu %lu %lu",&scp->mtime,&dummy1,&scp->atime,&dummy2
                                 );
          if (iVar9 != 4) {
            psVar18 = scp->command;
            sVar11 = psVar18->len;
            goto LAB_0010fe2c;
          }
          scp->got_file_times = true;
          goto LAB_0010fa9f;
        }
      }
LAB_0010fe2c:
      puVar4 = psVar18->u;
      uVar10 = string_length_for_printf(sVar11);
      pcVar15 = dupprintf("unrecognised scp command \'%.*s\'",(ulong)uVar10,puVar4);
      goto LAB_0010feaf;
    }
    iVar9 = 0;
  }
LAB_00110037:
  scp->crState = iVar9;
  return;
LAB_0010ffa2:
  (*scp->sf->vt->close)(scp->sf,&(scp->reply).srb,(scp->reply).handle);
LAB_0010ffc0:
  pSVar20 = scp->sc;
  pcVar15 = scp->errmsg;
  if (pcVar15 == (char *)0x0) {
    pSVar17 = pSVar20->vt;
  }
  else {
    sVar16 = strlen(pcVar15);
    (*pSVar20->vt->write)(pSVar20,true,pcVar15,sVar16);
    (*scp->sc->vt->write)(scp->sc,true,"\n",1);
    pSVar20 = scp->sc;
    pSVar17 = pSVar20->vt;
  }
  (*pSVar17->send_exit_status)(pSVar20,(uint)(pcVar15 != (char *)0x0));
  (*scp->sc->vt->write_eof)(scp->sc);
  (*scp->sc->vt->initiate_close)(scp->sc,scp->errmsg);
  iVar9 = 0x4e8;
  goto LAB_00110037;
}

Assistant:

static void scp_sink_coroutine(ScpSink *scp)
{
    crBegin(scp->crState);

    while (1) {
        /*
         * Send an ack, and read a command.
         */
        sshfwd_write(scp->sc, "\0", 1);
        strbuf_clear(scp->command);
        while (1) {
            crMaybeWaitUntilV(scp->input_eof || bufchain_size(&scp->data) > 0);
            if (scp->input_eof)
                goto done;

            ptrlen data = bufchain_prefix(&scp->data);
            const char *cdata = data.ptr;
            const char *newline = memchr(cdata, '\012', data.len);
            if (newline)
                data.len = (int)(newline+1 - cdata);
            put_data(scp->command, cdata, data.len);
            bufchain_consume(&scp->data, data.len);

            if (newline)
                break;
        }

        /*
         * Parse the command.
         */
        strbuf_chomp(scp->command, '\n');
        scp->command_chr = scp->command->len > 0 ? scp->command->s[0] : '\0';
        if (scp->command_chr == 'T') {
            unsigned long dummy1, dummy2;
            if (sscanf(scp->command->s, "T%lu %lu %lu %lu",
                       &scp->mtime, &dummy1, &scp->atime, &dummy2) != 4)
                goto parse_error;
            scp->got_file_times = true;
        } else if (scp->command_chr == 'C' || scp->command_chr == 'D') {
            /*
             * Common handling of the start of this case, because the
             * messages are parsed similarly. We diverge later.
             */
            const char *q, *p = scp->command->s + 1; /* skip the 'C' */

            scp->attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;
            scp->attrs.permissions = 0;
            while (*p >= '0' && *p <= '7') {
                scp->attrs.permissions =
                    scp->attrs.permissions * 8 + (*p - '0');
                p++;
            }
            if (*p != ' ')
                goto parse_error;
            p++;

            q = p;
            while (*p >= '0' && *p <= '9')
                p++;
            if (*p != ' ')
                goto parse_error;
            p++;
            scp->file_size = strtoull(q, NULL, 10);

            ptrlen leafname = make_ptrlen(
                p, scp->command->len - (p - scp->command->s));
            strbuf_clear(scp->filename_sb);
            put_datapl(scp->filename_sb, scp->head->destpath);
            if (scp->head->isdir) {
                if (scp->filename_sb->len > 0 &&
                    scp->filename_sb->s[scp->filename_sb->len-1]
                    != '/')
                    put_byte(scp->filename_sb, '/');
                put_datapl(scp->filename_sb, leafname);
            }
            scp->filename = ptrlen_from_strbuf(scp->filename_sb);

            if (scp->got_file_times) {
                scp->attrs.mtime = scp->mtime;
                scp->attrs.atime = scp->atime;
                scp->attrs.flags |= SSH_FILEXFER_ATTR_ACMODTIME;
            }
            scp->got_file_times = false;

            if (scp->command_chr == 'D') {
                sftpsrv_mkdir(scp->sf, &scp->reply.srb,
                              scp->filename, scp->attrs);

                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to create directory: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                scp_sink_push(scp, scp->filename, true);
            } else {
                sftpsrv_open(scp->sf, &scp->reply.srb, scp->filename,
                             SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                             scp->attrs);
                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to open file: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                /*
                 * Now send an ack, and read the file data.
                 */
                sshfwd_write(scp->sc, "\0", 1);
                scp->file_offset = 0;
                while (scp->file_offset < scp->file_size) {
                    ptrlen data;
                    uint64_t this_len, remaining;

                    crMaybeWaitUntilV(
                        scp->input_eof || bufchain_size(&scp->data) > 0);
                    if (scp->input_eof) {
                        sftpsrv_close(scp->sf, &scp->reply.srb,
                                      scp->reply.handle);
                        goto done;
                    }

                    data = bufchain_prefix(&scp->data);
                    this_len = data.len;
                    remaining = scp->file_size - scp->file_offset;
                    if (this_len > remaining)
                        this_len = remaining;
                    sftpsrv_write(scp->sf, &scp->reply.srb,
                                  scp->reply.handle, scp->file_offset,
                                  make_ptrlen(data.ptr, this_len));
                    if (scp->reply.err) {
                        scp->errmsg = dupprintf(
                            "'%.*s': unable to write to file: %s",
                            PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                        goto done;
                    }
                    bufchain_consume(&scp->data, this_len);
                    scp->file_offset += this_len;
                }

                /*
                 * Wait for the trailing NUL byte.
                 */
                crMaybeWaitUntilV(
                    scp->input_eof || bufchain_size(&scp->data) > 0);
                if (scp->input_eof) {
                    sftpsrv_close(scp->sf, &scp->reply.srb,
                                  scp->reply.handle);
                    goto done;
                }
                bufchain_consume(&scp->data, 1);
            }
        } else if (scp->command_chr == 'E') {
            if (!scp->head) {
                scp->errmsg = dupstr("received E command without matching D");
                goto done;
            }
            scp_sink_pop(scp);
            scp->got_file_times = false;
        } else {
            ptrlen cmd_pl;

            /*
             * Also come here if any of the above cases run into
             * parsing difficulties.
             */
          parse_error:
            cmd_pl = ptrlen_from_strbuf(scp->command);
            scp->errmsg = dupprintf("unrecognised scp command '%.*s'",
                                    PTRLEN_PRINTF(cmd_pl));
            goto done;
        }
    }

  done:
    if (scp->errmsg) {
        sshfwd_write_ext(scp->sc, true, scp->errmsg, strlen(scp->errmsg));
        sshfwd_write_ext(scp->sc, true, "\012", 1);
        sshfwd_send_exit_status(scp->sc, 1);
    } else {
        sshfwd_send_exit_status(scp->sc, 0);
    }
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->errmsg);
    while (1) crReturnV;

    crFinishV;
}